

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraClaus.c
# Opt level: O0

int Fra_ClausProcessClausesCut2(Clu_Man_t *p,Fra_Sml_t *pSimMan,Dar_Cut_t *pCut,int *pScores)

{
  int iVar1;
  uint *puVar2;
  int local_bc;
  int nWordsForSim;
  int b;
  int k;
  int i;
  int iMint;
  uint uWord;
  uint *pSims [16];
  int *pScores_local;
  Dar_Cut_t *pCut_local;
  Fra_Sml_t *pSimMan_local;
  Clu_Man_t *p_local;
  
  iVar1 = pSimMan->nWordsTotal - p->nSimWordsPref;
  pSims[0xf] = (uint *)pScores;
  if ((1 < *(uint *)&pCut->field_0x4 >> 0x1d) && (*(uint *)&pCut->field_0x4 >> 0x1d < 5)) {
    if (iVar1 % 8 == 0) {
      for (b = 0; b < (int)(*(uint *)&pCut->field_0x4 >> 0x1d); b = b + 1) {
        puVar2 = Fra_ObjSim(pSimMan,pCut->pLeaves[b]);
        *(uint **)(&iMint + (long)b * 2) = puVar2 + p->nSimWordsPref;
      }
      memset(pSims[0xf],0,0x40);
      for (b = 0; b < iVar1; b = b + 1) {
        for (nWordsForSim = 0; nWordsForSim < 0x20; nWordsForSim = nWordsForSim + 1) {
          k = 0;
          for (local_bc = 0; local_bc < (int)(*(uint *)&pCut->field_0x4 >> 0x1d);
              local_bc = local_bc + 1) {
            if ((*(uint *)(*(long *)(&iMint + (long)local_bc * 2) + (long)b * 4) &
                1 << ((byte)nWordsForSim & 0x1f)) != 0) {
              k = 1 << ((byte)local_bc & 0x1f) | k;
            }
          }
          pSims[0xf][k] = pSims[0xf][k] + 1;
        }
      }
      i = 0;
      for (b = 0; b < 0x10; b = b + 1) {
        if (pSims[0xf][b] != 0) {
          i = 1 << ((byte)b & 0x1f) | i;
        }
      }
      return i;
    }
    __assert_fail("nWordsForSim % 8 == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/fra/fraClaus.c"
                  ,0xff,
                  "int Fra_ClausProcessClausesCut2(Clu_Man_t *, Fra_Sml_t *, Dar_Cut_t *, int *)");
  }
  __assert_fail("pCut->nLeaves > 1 && pCut->nLeaves < 5",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/fra/fraClaus.c"
                ,0xfe,
                "int Fra_ClausProcessClausesCut2(Clu_Man_t *, Fra_Sml_t *, Dar_Cut_t *, int *)");
}

Assistant:

int Fra_ClausProcessClausesCut2( Clu_Man_t * p, Fra_Sml_t * pSimMan, Dar_Cut_t * pCut, int * pScores )
{
    unsigned * pSims[16], uWord;
    int iMint, i, k, b;
    int nWordsForSim = pSimMan->nWordsTotal - p->nSimWordsPref;
    // compute parameters
    assert( pCut->nLeaves > 1 && pCut->nLeaves < 5 );
    assert( nWordsForSim % 8 == 0 );
    // get parameters
    for ( i = 0; i < (int)pCut->nLeaves; i++ )
        pSims[i] = Fra_ObjSim( pSimMan, pCut->pLeaves[i] ) + p->nSimWordsPref;
    // add combinational patterns
    memset( pScores, 0, sizeof(int) * 16 );
    for ( i = 0; i < nWordsForSim; i++ )
        for ( k = 0; k < 32; k++ )
        {
            iMint = 0;
            for ( b = 0; b < (int)pCut->nLeaves; b++ )
                if ( pSims[b][i] & (1 << k) )
                    iMint |= (1 << b);
            pScores[iMint]++;
        }
    // collect patterns
    uWord = 0;
    for ( i = 0; i < 16; i++ )
        if ( pScores[i] )
            uWord |= (1 << i);
//    Extra_PrintBinary( stdout, &uWord, 16 ); printf( "\n" );
    return (int)uWord;
}